

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

Gia_Man_t * Gia_ManSpecReduceTrace(Gia_Man_t *p,Vec_Int_t *vTrace,Vec_Int_t *vMap)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  int iVar6;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    Abc_Print(1,"Gia_ManSpecReduce(): Equivalence classes are not available.\n");
    pGVar5 = (Gia_Man_t *)0x0;
  }
  else {
    vTrace->nSize = 0;
    p_00 = Vec_IntAlloc(1000);
    Gia_ManSetPhase(p);
    Gia_ManFillValue(p);
    p_01 = Gia_ManStart(p->nObjs);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_01->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_01->pSpec = pcVar3;
    Gia_ManHashAlloc(p_01);
    p->pObjs->Value = 0;
    for (iVar6 = 0; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
      pGVar4 = Gia_ManCi(p,iVar6);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar1 = Gia_ManAppendCi(p_01);
      pGVar4->Value = uVar1;
    }
    iVar6 = 0;
    while( true ) {
      if (p->nRegs <= iVar6) break;
      pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar6);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      Gia_ManSpecBuild(p_01,p,pGVar4,p_00,0,1,vTrace,(Vec_Int_t *)0x0,vMap);
      iVar6 = iVar6 + 1;
    }
    for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
      pGVar4 = Gia_ManCo(p,iVar6);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      Gia_ManSpecReduce_rec
                (p_01,p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff),p_00,0,1,vTrace,
                 (Vec_Int_t *)0x0,vMap);
    }
    for (iVar6 = 0; iVar6 < p->vCos->nSize - p->nRegs; iVar6 = iVar6 + 1) {
      pGVar4 = Gia_ManCo(p,iVar6);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      Gia_ManAppendCo(p_01,iVar2);
    }
    for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
      iVar2 = Vec_IntEntry(p_00,iVar6);
      Gia_ManAppendCo(p_01,iVar2);
    }
    if (p_00->nSize == 0) {
      Abc_Print(1,"Speculatively reduced model has no primary outputs.\n");
      Gia_ManAppendCo(p_01,0);
    }
    for (iVar6 = 0; iVar6 < p->nRegs; iVar6 = iVar6 + 1) {
      pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar6);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      Gia_ManAppendCo(p_01,iVar2);
    }
    Gia_ManHashStop(p_01);
    Vec_IntFree(p_00);
    Gia_ManSetRegNum(p_01,p->nRegs);
    pGVar5 = Gia_ManCleanup(p_01);
    Gia_ManStop(p_01);
  }
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_ManSpecReduceTrace( Gia_Man_t * p, Vec_Int_t * vTrace, Vec_Int_t * vMap )
{
    Vec_Int_t * vXorLits;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLitNew;
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManSpecReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    Vec_IntClear( vTrace );
    vXorLits = Vec_IntAlloc( 1000 );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManSpecBuild( pNew, p, pObj, vXorLits, 0, 1, vTrace, NULL, vMap );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, 0, 1, vTrace, NULL, vMap );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Vec_IntForEachEntry( vXorLits, iLitNew, i )
        Gia_ManAppendCo( pNew, iLitNew );
    if ( Vec_IntSize(vXorLits) == 0 )
    {
        Abc_Print( 1, "Speculatively reduced model has no primary outputs.\n" );
        Gia_ManAppendCo( pNew, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Vec_IntFree( vXorLits );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}